

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O1

ZhouParameters * __thiscall
OpenMD::EAMAdapter::getZhouParam(ZhouParameters *__return_storage_ptr__,EAMAdapter *this)

{
  bool bVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<OpenMD::GenericData> data;
  undefined1 local_58 [16];
  string local_48;
  
  bVar1 = AtomType::hasProperty(this->at_,(string *)OpenMD::EAMtypeID_abi_cxx11_);
  if (!bVar1) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "EAMAdapter::getZhouParam was passed an atomType (%s)\n\tthat does not appear to be an EAM atom.\n"
             ,local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  AtomType::getPropertyByName((AtomType *)local_58,(string *)this->at_);
  if ((_func_int **)local_58._0_8_ == (_func_int **)0x0) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "EAMAdapter::getZhouParam could not find Zhou\n\tparameters for atomType %s.\n",
             local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  if ((_func_int **)local_58._0_8_ == (_func_int **)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = __dynamic_cast(local_58._0_8_,&GenericData::typeinfo,
                           &SimpleTypeData<OpenMD::ZhouParameters>::typeinfo,0);
  }
  if (lVar2 == 0) {
    lVar2 = 0;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_58._8_8_ + 8) = *(_Atomic_word *)(local_58._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_58._8_8_ + 8) = *(_Atomic_word *)(local_58._8_8_ + 8) + 1;
      }
    }
  }
  if (lVar2 == 0) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "EAMAdapter::getZhouParam could not convert\n\tGenericData to ZhouData for atom type %s\n"
             ,local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  ZhouParameters::ZhouParameters(__return_storage_ptr__,(ZhouParameters *)(lVar2 + 0x28));
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

ZhouParameters EAMAdapter::getZhouParam() {
    if (!isEAM()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAMAdapter::getZhouParam was passed an atomType (%s)\n"
               "\tthat does not appear to be an EAM atom.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(ZhouTypeID);
    if (data == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAMAdapter::getZhouParam could not find Zhou\n"
               "\tparameters for atomType %s.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<ZhouData> zhouData =
        std::dynamic_pointer_cast<ZhouData>(data);
    if (zhouData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAMAdapter::getZhouParam could not convert\n"
               "\tGenericData to ZhouData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return zhouData->getData();
  }